

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O1

void __thiscall YAML::Emitter::BlockMapPrepareLongKeyValue(Emitter *this,value child)

{
  ostream_wrapper *this_00;
  _Head_base<0UL,_YAML::EmitterState_*,_false> _Var1;
  ulong uVar2;
  size_t in_RCX;
  undefined1 local_29;
  
  if (child != NoType) {
    _Var1._M_head_impl =
         (this->m_pState)._M_t.
         super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>._M_t.
         super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
         super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl;
    uVar2 = (_Var1._M_head_impl)->m_curIndent;
    if (((_Var1._M_head_impl)->m_hasAnchor == false) && (((_Var1._M_head_impl)->m_hasTag & 1U) == 0)
       ) {
      this_00 = &this->m_stream;
      ostream_wrapper::write(this_00,0x76ce52,(void *)0x1,in_RCX);
      if ((this->m_stream).m_col < uVar2) {
        do {
          local_29 = 0x20;
          ostream_wrapper::write(this_00,(int)&local_29,(void *)0x1,in_RCX);
        } while ((this->m_stream).m_col < uVar2);
      }
      ostream_wrapper::write(this_00,0x76104d,(void *)0x1,in_RCX);
    }
    if (child < (BlockMap|Property)) {
      if ((0x2eU >> (child & 0x1f) & 1) == 0) {
        if ((0x50U >> (child & 0x1f) & 1) == 0) {
          return;
        }
        _Var1._M_head_impl =
             (this->m_pState)._M_t.
             super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>.
             _M_t.
             super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
             super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl;
        if (((_Var1._M_head_impl)->m_hasAnchor != false) ||
           (((_Var1._M_head_impl)->m_hasTag & 1U) != 0)) {
          ostream_wrapper::write(&this->m_stream,0x76ce52,(void *)0x1,in_RCX);
        }
      }
      SpaceOrIndentTo(this,true,uVar2 + 1);
    }
  }
  return;
}

Assistant:

void Emitter::BlockMapPrepareLongKeyValue(EmitterNodeType::value child) {
  const std::size_t curIndent = m_pState->CurIndent();

  if (child == EmitterNodeType::NoType)
    return;

  if (!m_pState->HasBegunContent()) {
    m_stream << "\n";
    m_stream << IndentTo(curIndent);
    m_stream << ":";
  }

  switch (child) {
    case EmitterNodeType::NoType:
      break;
    case EmitterNodeType::Property:
    case EmitterNodeType::Scalar:
    case EmitterNodeType::FlowSeq:
    case EmitterNodeType::FlowMap:
      SpaceOrIndentTo(true, curIndent + 1);
      break;
    case EmitterNodeType::BlockSeq:
    case EmitterNodeType::BlockMap:
      if (m_pState->HasBegunContent())
        m_stream << "\n";
      SpaceOrIndentTo(true, curIndent + 1);
      break;
  }
}